

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O1

void __thiscall
Assimp::PLYImporter::LoadFace
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  aiFace *paVar1;
  aiMesh *paVar2;
  pointer pPVar3;
  pointer pPVar4;
  long lVar5;
  ulong *puVar6;
  aiFace *paVar7;
  uint *puVar8;
  aiVector3D *__s;
  runtime_error *prVar9;
  pointer pPVar10;
  bool bVar11;
  ulong uVar12;
  PLYImporter *pPVar13;
  ulong uVar14;
  double dVar15;
  Element *pEVar16;
  int iVar17;
  EDataType EVar18;
  EDataType EVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  int iVar25;
  pointer pVVar26;
  float fVar27;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  PLYImporter *local_50;
  Element *local_48;
  ulong local_40;
  aiMesh *local_38;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fd,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fe,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  paVar2 = this->mGeneratedMesh;
  if (paVar2 == (aiMesh *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Invalid .ply file: Vertices should be declared before faces","");
    std::runtime_error::runtime_error(prVar9,(string *)local_70);
    *(undefined ***)prVar9 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pcElement->eSemantic == EEST_TriStrip) {
    pPVar10 = (pcElement->alProperties).
              super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (pcElement->alProperties).
             super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    iVar25 = -1;
    EVar19 = EDT_Char;
    if (pPVar10 != pPVar3) {
      iVar20 = 0;
      do {
        if (pPVar10->bIsList == true) {
          EVar18 = pPVar10->eType;
          bVar24 = true;
          bVar11 = bVar24;
          goto LAB_0048f428;
        }
        pPVar10 = pPVar10 + 1;
        iVar20 = iVar20 + 1;
      } while (pPVar10 != pPVar3);
    }
    EVar18 = EDT_Char;
    iVar20 = -1;
    bVar24 = false;
    bVar11 = bVar24;
  }
  else {
    iVar25 = -1;
    if (pcElement->eSemantic == EEST_Face) {
      pPVar10 = (pcElement->alProperties).
                super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar3 = (pcElement->alProperties).
               super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar10 != pPVar3) {
        bVar11 = false;
        iVar20 = -1;
        EVar18 = EDT_Char;
        EVar19 = EDT_Char;
        iVar17 = 0;
        do {
          if (pPVar10->Semantic == EST_TextureCoordinates) {
            if (pPVar10->bIsList == true) {
              EVar19 = pPVar10->eType;
              bVar11 = true;
              iVar25 = iVar17;
            }
          }
          else if ((pPVar10->Semantic == EST_VertexIndex) && (pPVar10->bIsList == true)) {
            EVar18 = pPVar10->eType;
            bVar11 = true;
            iVar20 = iVar17;
          }
          pPVar10 = pPVar10 + 1;
          iVar17 = iVar17 + 1;
        } while (pPVar10 != pPVar3);
        bVar24 = false;
        goto LAB_0048f428;
      }
    }
    EVar19 = EDT_Char;
    bVar24 = false;
    EVar18 = EDT_Char;
    iVar20 = -1;
    bVar11 = false;
  }
LAB_0048f428:
  if (bVar11) {
    local_50 = this;
    local_48 = pcElement;
    if (paVar2->mFaces == (aiFace *)0x0) {
      paVar2->mNumFaces = pcElement->NumOccur;
      paVar2 = this->mGeneratedMesh;
      uVar12 = (ulong)paVar2->mNumFaces;
      puVar6 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar6 + 1);
      *puVar6 = uVar12;
      if (uVar12 != 0) {
        paVar7 = paVar1;
        do {
          paVar7->mNumIndices = 0;
          paVar7->mIndices = (uint *)0x0;
          paVar7 = paVar7 + 1;
        } while (paVar7 != paVar1 + uVar12);
      }
      paVar2->mFaces = paVar1;
    }
    if (bVar24) {
      uVar14 = (ulong)iVar20;
      pPVar4 = (instElement->alProperties).
               super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(instElement->alProperties).
                      super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
               -0x5555555555555555;
      if (uVar12 < uVar14 || uVar12 - uVar14 == 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"Invalid .ply file: Property index is out of range.","");
        std::runtime_error::runtime_error(prVar9,(string *)local_70);
        *(undefined ***)prVar9 = &PTR__runtime_error_008e3168;
        __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pVVar26 = *(pointer *)
                 &pPVar4[uVar14].avList.
                  super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      if (pVVar26 !=
          *(pointer *)
           ((long)&pPVar4[uVar14].avList.
                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
           + 8)) {
        uVar22 = 0xffffffff;
        bVar24 = false;
        uVar21 = 0xffffffff;
        pPVar13 = local_50;
        do {
          if (EVar18 < EDT_INVALID) {
            (*(code *)(&DAT_0076d5b0 + *(int *)(&DAT_0076d5b0 + (ulong)EVar18 * 4)))();
            return;
          }
          if (uVar22 == 0xffffffff) {
            uVar22 = 0;
          }
          else if (uVar21 == 0xffffffff) {
            uVar21 = 0;
          }
          else {
            if (pPVar13->mGeneratedMesh->mFaces == (aiFace *)0x0) {
              pPVar13->mGeneratedMesh->mNumFaces = local_48->NumOccur;
              local_38 = pPVar13->mGeneratedMesh;
              uVar12 = (ulong)local_38->mNumFaces;
              local_40 = uVar12;
              puVar6 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
              paVar1 = (aiFace *)(puVar6 + 1);
              *puVar6 = local_40;
              if (local_40 != 0) {
                paVar7 = paVar1;
                do {
                  paVar7->mNumIndices = 0;
                  paVar7->mIndices = (uint *)0x0;
                  paVar7 = paVar7 + 1;
                } while (paVar7 != paVar1 + uVar12);
              }
              local_38->mFaces = paVar1;
              pPVar13 = local_50;
            }
            pPVar13->mGeneratedMesh->mFaces[pos].mNumIndices = 3;
            puVar8 = (uint *)operator_new__(0xc);
            local_50->mGeneratedMesh->mFaces[pos].mIndices = puVar8;
            *local_50->mGeneratedMesh->mFaces[pos].mIndices = uVar22;
            local_50->mGeneratedMesh->mFaces[pos].mIndices[1] = uVar21;
            local_50->mGeneratedMesh->mFaces[pos].mIndices[2] = 0;
            if (!bVar24) {
              puVar8 = local_50->mGeneratedMesh->mFaces[pos].mIndices;
              uVar22 = *puVar8;
              *puVar8 = puVar8[1];
              puVar8[1] = uVar22;
            }
            pPVar13 = local_50;
            uVar22 = uVar21;
            uVar21 = 0;
            bVar24 = (bool)(bVar24 ^ 1);
          }
          pVVar26 = pVVar26 + 1;
        } while (pVVar26 !=
                 *(pointer *)
                  ((long)&pPVar4[uVar14].avList.
                          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                  + 8));
      }
    }
    else {
      if (iVar20 != -1) {
        uVar14 = (ulong)iVar20;
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar12 < uVar14 || uVar12 - uVar14 == 0) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar9,(string *)local_70);
          *(undefined ***)prVar9 = &PTR__runtime_error_008e3168;
          __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar12 = (long)*(pointer *)
                        ((long)&pPVar4[uVar14].avList.
                                super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                        + 8) -
                 *(long *)&pPVar4[uVar14].avList.
                           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ;
        uVar23 = uVar12 >> 3;
        uVar22 = (uint)uVar23;
        local_50->mGeneratedMesh->mFaces[pos].mNumIndices = uVar22;
        puVar8 = (uint *)operator_new__(uVar12 >> 1 & 0x3fffffffc);
        local_50->mGeneratedMesh->mFaces[pos].mIndices = puVar8;
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar12 < uVar14 || uVar12 - uVar14 == 0) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar9,(string *)local_70);
          *(undefined ***)prVar9 = &PTR__runtime_error_008e3168;
          __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (uVar22 != 0) {
          lVar5 = *(long *)&pPVar4[uVar14].avList.
                            super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
          ;
          uVar12 = 0;
          do {
            dVar15 = 0.0;
            if (EVar18 < EDT_INVALID) {
              dVar15 = *(double *)(lVar5 + uVar12 * 8);
              switch(EVar18) {
              case EDT_Float:
                dVar15 = (double)(long)SUB84(dVar15,0);
                break;
              case EDT_Double:
                dVar15 = (double)(long)dVar15;
              }
            }
            local_50->mGeneratedMesh->mFaces[pos].mIndices[uVar12] = SUB84(dVar15,0);
            uVar12 = uVar12 + 1;
          } while ((uVar23 & 0xffffffff) != uVar12);
        }
      }
      if (iVar25 != -1) {
        uVar14 = (ulong)iVar25;
        pPVar4 = (instElement->alProperties).
                 super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(instElement->alProperties).
                        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                 -0x5555555555555555;
        if (uVar12 < uVar14 || uVar12 - uVar14 == 0) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Invalid .ply file: Property index is out of range.","");
          std::runtime_error::runtime_error(prVar9,(string *)local_70);
          *(undefined ***)prVar9 = &PTR__runtime_error_008e3168;
          __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar5 = *(long *)&pPVar4[uVar14].avList.
                          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ;
        pEVar16 = (Element *)
                  ((ulong)((long)*(pointer *)
                                  ((long)&pPVar4[uVar14].avList.
                                          super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                  + 8) - lVar5) >> 3);
        if ((int)pEVar16 - 6U < 3) {
          uVar12 = 0;
          pPVar13 = local_50;
          local_48 = pEVar16;
          do {
            paVar2 = pPVar13->mGeneratedMesh;
            uVar22 = paVar2->mFaces[pos].mIndices[uVar12 >> 1 & 0x7fffffff];
            if (uVar22 < paVar2->mNumVertices) {
              if (paVar2->mTextureCoords[0] == (aiVector3D *)0x0) {
                paVar2->mNumUVComponents[0] = 2;
                paVar2 = pPVar13->mGeneratedMesh;
                uVar21 = paVar2->mNumVertices;
                __s = (aiVector3D *)operator_new__((ulong)uVar21 * 0xc);
                if (uVar21 != 0) {
                  memset(__s,0,(((ulong)uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                }
                paVar2->mTextureCoords[0] = __s;
                pPVar13 = local_50;
                pEVar16 = local_48;
              }
              dVar15 = *(double *)(lVar5 + uVar12 * 8);
              fVar27 = SUB84(dVar15,0);
              if ((uVar12 & 1) == 0) {
                switch(EVar19) {
                case EDT_Char:
                case EDT_Short:
                case EDT_Int:
                  fVar27 = (float)(int)fVar27;
                  break;
                case EDT_UChar:
                case EDT_UShort:
                case EDT_UInt:
                  fVar27 = (float)((ulong)dVar15 & 0xffffffff);
                  break;
                case EDT_Float:
                  break;
                case EDT_Double:
                  fVar27 = (float)dVar15;
                  break;
                default:
                  fVar27 = 0.0;
                }
                pPVar13->mGeneratedMesh->mTextureCoords[0][uVar22].x = fVar27;
              }
              else {
                switch(EVar19) {
                case EDT_Char:
                case EDT_Short:
                case EDT_Int:
                  fVar27 = (float)(int)fVar27;
                  break;
                case EDT_UChar:
                case EDT_UShort:
                case EDT_UInt:
                  fVar27 = (float)((ulong)dVar15 & 0xffffffff);
                  break;
                case EDT_Float:
                  break;
                case EDT_Double:
                  fVar27 = (float)dVar15;
                  break;
                default:
                  fVar27 = 0.0;
                }
                pPVar13->mGeneratedMesh->mTextureCoords[0][uVar22].y = fVar27;
              }
              pPVar13->mGeneratedMesh->mTextureCoords[0][uVar22].z = 0.0;
            }
            uVar12 = uVar12 + 1;
          } while ((int)pEVar16 != (int)uVar12);
        }
      }
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadFace(const PLY::Element* pcElement, const PLY::ElementInstance* instElement,
        unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    if (mGeneratedMesh == nullptr) {
        throw DeadlyImportError("Invalid .ply file: Vertices should be declared before faces");
    }

    bool bOne = false;

    // index of the vertex index list
    unsigned int iProperty = 0xFFFFFFFF;
    PLY::EDataType eType = EDT_Char;
    bool bIsTriStrip = false;

    // index of the material index property
    //unsigned int iMaterialIndex = 0xFFFFFFFF;
    //PLY::EDataType eType2 = EDT_Char;

    // texture coordinates
    unsigned int iTextureCoord = 0xFFFFFFFF;
    PLY::EDataType eType3 = EDT_Char;

    // face = unique number of vertex indices
    if (PLY::EEST_Face == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            if (PLY::EST_VertexIndex == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }

                iProperty = _a;
                bOne = true;
                eType = (*a).eType;
            } else if (PLY::EST_TextureCoordinates == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }
                iTextureCoord = _a;
                bOne = true;
                eType3 = (*a).eType;
            }
        }
    }
    // triangle strip
    // TODO: triangle strip and material index support???
    else if (PLY::EEST_TriStrip == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            // must be a dynamic list!
            if (!(*a).bIsList) {
                continue;
            }
            iProperty = _a;
            bOne = true;
            bIsTriStrip = true;
            eType = (*a).eType;
            break;
        }
    }

    // check whether we have at least one per-face information set
    if (bOne) {
        if (mGeneratedMesh->mFaces == nullptr) {
            mGeneratedMesh->mNumFaces = pcElement->NumOccur;
            mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
        }

        if (!bIsTriStrip) {
            // parse the list of vertex indices
            if (0xFFFFFFFF != iProperty) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iProperty).avList.size();
                mGeneratedMesh->mFaces[pos].mNumIndices = iNum;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[iNum];

                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iProperty).avList.begin();

                for (unsigned int a = 0; a < iNum; ++a, ++p) {
                    mGeneratedMesh->mFaces[pos].mIndices[a] = PLY::PropertyInstance::ConvertTo<unsigned int>(*p, eType);
                }
            }

        // parse the material index
        // cannot be handled without processing the whole file first
        /*if (0xFFFFFFFF != iMaterialIndex)
        {
            mGeneratedMesh->mFaces[pos]. = PLY::PropertyInstance::ConvertTo<unsigned int>(
            GetProperty(instElement->alProperties, iMaterialIndex).avList.front(), eType2);
        }*/

            if (0xFFFFFFFF != iTextureCoord) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iTextureCoord).avList.size();

                //should be 6 coords
                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iTextureCoord).avList.begin();

                if ((iNum / 3) == 2) // X Y coord
                {
                    for (unsigned int a = 0; a < iNum; ++a, ++p) {
                        unsigned int vindex = mGeneratedMesh->mFaces[pos].mIndices[a / 2];
                        if (vindex < mGeneratedMesh->mNumVertices) {
                            if (mGeneratedMesh->mTextureCoords[0] == nullptr ) {
                                mGeneratedMesh->mNumUVComponents[0] = 2;
                                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
                            }

                            if (a % 2 == 0) {
                                mGeneratedMesh->mTextureCoords[0][vindex].x = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            } else {
                                mGeneratedMesh->mTextureCoords[0][vindex].y = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            }

                            mGeneratedMesh->mTextureCoords[0][vindex].z = 0;
                        }
                    }
                }
            }
        } else { // triangle strips
            // normally we have only one triangle strip instance where
            // a value of -1 indicates a restart of the strip
            bool flip = false;
            const std::vector<PLY::PropertyInstance::ValueUnion>& quak = GetProperty(instElement->alProperties, iProperty).avList;
            //pvOut->reserve(pvOut->size() + quak.size() + (quak.size()>>2u)); //Limits memory consumption

            int aiTable[2] = { -1, -1 };
            for (std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator a = quak.begin(); a != quak.end(); ++a)  {
                const int p = PLY::PropertyInstance::ConvertTo<int>(*a, eType);

                if (-1 == p) {
                    // restart the strip ...
                    aiTable[0] = aiTable[1] = -1;
                    flip = false;
                    continue;
                }
                if (-1 == aiTable[0]) {
                    aiTable[0] = p;
                    continue;
                }
                if (-1 == aiTable[1]) {
                    aiTable[1] = p;
                    continue;
                }

                if (mGeneratedMesh->mFaces == nullptr) {
                    mGeneratedMesh->mNumFaces = pcElement->NumOccur;
                    mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
                }

                mGeneratedMesh->mFaces[pos].mNumIndices = 3;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[3];
                mGeneratedMesh->mFaces[pos].mIndices[0] = aiTable[0];
                mGeneratedMesh->mFaces[pos].mIndices[1] = aiTable[1];
                mGeneratedMesh->mFaces[pos].mIndices[2] = p;

                // every second pass swap the indices.
                flip = !flip;
                if ( flip ) {
                    std::swap(mGeneratedMesh->mFaces[pos].mIndices[0], mGeneratedMesh->mFaces[pos].mIndices[1]);
                }

                aiTable[0] = aiTable[1];
                aiTable[1] = p;
            }
        }
    }
}